

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::GoniometricLight::Phi(GoniometricLight *this,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  Float FVar5;
  undefined1 auVar11 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  Float local_9c;
  WrapMode2D local_88;
  SampledSpectrum local_80;
  SampledSpectrum local_70;
  SampledSpectrum local_60;
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  lVar3 = 0;
  local_9c = 0.0;
  for (lVar2 = 0; auVar17 = in_ZMM1._8_56_, lVar2 < (long)TVar1 >> 0x20; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 < TVar1.x; lVar4 = lVar4 + 1) {
      WrapMode2D::WrapMode2D(&local_88,Clamp);
      FVar5 = Image::GetChannel(&this->image,(Point2i)(lVar3 + lVar4),0,local_88);
      TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      local_9c = local_9c + FVar5;
      in_ZMM1 = ZEXT464((uint)local_9c);
    }
    lVar3 = lVar3 + 0x100000000;
  }
  FVar5 = this->scale;
  auVar11 = (undefined1  [56])0x0;
  SVar18 = DenselySampledSpectrum::Sample(&this->Iemit,lambda);
  auVar12._0_8_ = SVar18.values.values._8_8_;
  auVar12._8_56_ = auVar17;
  auVar6._0_8_ = SVar18.values.values._0_8_;
  auVar6._8_56_ = auVar11;
  local_80.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar12._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar18 = SampledSpectrum::operator*(&local_80,FVar5);
  auVar13._0_8_ = SVar18.values.values._8_8_;
  auVar13._8_56_ = auVar17;
  auVar7._0_8_ = SVar18.values.values._0_8_;
  auVar7._8_56_ = auVar11;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar13._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar18 = SampledSpectrum::operator*(&local_70,4.0);
  auVar14._0_8_ = SVar18.values.values._8_8_;
  auVar14._8_56_ = auVar17;
  auVar8._0_8_ = SVar18.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  local_60.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar14._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar18 = SampledSpectrum::operator*(&local_60,3.1415927);
  auVar15._0_8_ = SVar18.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar9._0_8_ = SVar18.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar15._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar18 = SampledSpectrum::operator*(&local_50,local_9c);
  auVar16._0_8_ = SVar18.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar10._0_8_ = SVar18.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar16._0_16_);
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  SVar18 = SampledSpectrum::operator/(&local_40,(float)(TVar1.y * TVar1.x));
  return (array<float,_4>)(array<float,_4>)SVar18;
}

Assistant:

SampledSpectrum GoniometricLight::Phi(const SampledWavelengths &lambda) const {
    Float sumY = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            sumY += image.GetChannel({x, y}, 0);
    return scale * Iemit.Sample(lambda) * 4 * Pi * sumY /
           (image.Resolution().x * image.Resolution().y);
}